

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantPool.cc
# Opt level: O0

size_t __thiscall flow::ConstantPool::makeHandler(ConstantPool *this,string *name)

{
  __type_conflict2 _Var1;
  size_type sVar2;
  reference pvVar3;
  size_t e;
  size_t i;
  string *name_local;
  ConstantPool *this_local;
  
  e = 0;
  sVar2 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::size(&this->handlers_);
  while( true ) {
    if (e == sVar2) {
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::resize(&this->handlers_,e + 1);
      pvVar3 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::operator[](&this->handlers_,e);
      std::__cxx11::string::operator=((string *)pvVar3,(string *)name);
      return e;
    }
    pvVar3 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::operator[](&this->handlers_,e);
    _Var1 = std::operator==(&pvVar3->first,name);
    if (_Var1) break;
    e = e + 1;
  }
  return e;
}

Assistant:

size_t ConstantPool::makeHandler(const std::string& name) {
  size_t i = 0;
  size_t e = handlers_.size();

  while (i != e) {
    if (handlers_[i].first == name) {
      return i;
    }

    ++i;
  }

  handlers_.resize(i + 1);
  handlers_[i].first = name;
  return i;
}